

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProcessingQCOMDecoration
          (ValidationState_t *_,int id,Decoration decor)

{
  bool bVar1;
  Op OVar2;
  DiagnosticStream *pDVar3;
  string local_410;
  DiagnosticStream local_3f0;
  uint32_t local_214;
  undefined1 local_210 [4];
  int texture_id;
  uint32_t local_38;
  undefined1 local_31;
  int t_idx;
  bool is_intf_obj;
  Instruction *ld_inst;
  Instruction *si_inst;
  Decoration decor_local;
  int id_local;
  ValidationState_t *__local;
  
  ld_inst = (Instruction *)0x0;
  si_inst._0_4_ = decor;
  si_inst._4_4_ = id;
  _decor_local = _;
  _t_idx = ValidationState_t::FindDef(_,id);
  OVar2 = val::Instruction::opcode(_t_idx);
  local_31 = OVar2 == OpSampledImage;
  if ((bool)local_31) {
    ld_inst = _t_idx;
    local_38 = val::Instruction::GetOperandAs<int>(_t_idx,2);
    _t_idx = ValidationState_t::FindDef(_decor_local,local_38);
  }
  OVar2 = val::Instruction::opcode(_t_idx);
  if (OVar2 == OpLoad) {
    local_214 = val::Instruction::GetOperandAs<int>(_t_idx,2);
    bVar1 = ValidationState_t::HasDecoration(_decor_local,local_214,(Decoration)si_inst);
    if (bVar1) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag(&local_3f0,_decor_local,SPV_ERROR_INVALID_DATA,_t_idx);
      pDVar3 = DiagnosticStream::operator<<(&local_3f0,(char (*) [20])"Missing decoration ");
      ValidationState_t::SpvDecorationString_abi_cxx11_(&local_410,_decor_local,(Decoration)si_inst)
      ;
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_410);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_410);
      DiagnosticStream::~DiagnosticStream(&local_3f0);
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_210,_decor_local,SPV_ERROR_INVALID_DATA,_t_idx);
    pDVar3 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_210,(char (*) [21])"Expect to see OpLoad");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_210);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageProcessingQCOMDecoration(ValidationState_t& _, int id,
                                                   spv::Decoration decor) {
  const Instruction* si_inst = nullptr;
  const Instruction* ld_inst = _.FindDef(id);
  bool is_intf_obj = (ld_inst->opcode() == spv::Op::OpSampledImage);
  if (is_intf_obj == true) {
    si_inst = ld_inst;
    int t_idx = si_inst->GetOperandAs<int>(2);  // texture
    ld_inst = _.FindDef(t_idx);
  }
  if (ld_inst->opcode() != spv::Op::OpLoad) {
    return _.diag(SPV_ERROR_INVALID_DATA, ld_inst) << "Expect to see OpLoad";
  }
  int texture_id = ld_inst->GetOperandAs<int>(2);  // variable to load
  if (!_.HasDecoration(texture_id, decor)) {
    return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
           << "Missing decoration " << _.SpvDecorationString(decor);
  }

  return SPV_SUCCESS;
}